

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O0

void png_set_pHYs(png_const_structrp png_ptr,png_inforp info_ptr,png_uint_32 res_x,png_uint_32 res_y
                 ,int unit_type)

{
  int unit_type_local;
  png_uint_32 res_y_local;
  png_uint_32 res_x_local;
  png_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  if ((png_ptr != (png_const_structrp)0x0) && (info_ptr != (png_inforp)0x0)) {
    info_ptr->x_pixels_per_unit = res_x;
    info_ptr->y_pixels_per_unit = res_y;
    info_ptr->phys_unit_type = (png_byte)unit_type;
    info_ptr->valid = info_ptr->valid | 0x80;
  }
  return;
}

Assistant:

void PNGAPI
png_set_pHYs(png_const_structrp png_ptr, png_inforp info_ptr,
    png_uint_32 res_x, png_uint_32 res_y, int unit_type)
{
   png_debug1(1, "in %s storage function", "pHYs");

   if (png_ptr == NULL || info_ptr == NULL)
      return;

   info_ptr->x_pixels_per_unit = res_x;
   info_ptr->y_pixels_per_unit = res_y;
   info_ptr->phys_unit_type = (png_byte)unit_type;
   info_ptr->valid |= PNG_INFO_pHYs;
}